

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

Type * __thiscall
QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>::operator->
          (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>
           *this)

{
  int iVar1;
  
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>>::
      instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QThreadStorageData::QThreadStorageData
                ((QThreadStorageData *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>>
                  ::instance()::holder,
                 QThreadStorage<(anonymous_namespace)::GenerationalCollator>::deleteData);
      __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>::~Holder,
                   &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>>
                    ::instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>>
                           ::instance()::holder);
    }
  }
  return (Type *)&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>>
                  ::instance()::holder;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }